

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

string * __thiscall
lambda::parse_from(std::istream&)::helper::get_var_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  Parse_error *this_00;
  Shared_string local_38;
  int local_1c;
  void *pvStack_18;
  int_type ch;
  helper *this_local;
  string *buffer;
  
  pvStack_18 = this;
  this_local = (helper *)__return_storage_ptr__;
  parse_from::helper::eat_whitespace((helper *)this);
  local_1c = std::istream::get();
  if ((local_1c == 0x28) && (iVar1 = std::istream::peek(), iVar1 == 0x2a)) {
    std::istream::get();
    parse_from::helper::comment((helper *)this);
    get_var_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    iVar1 = isalpha(local_1c);
    if ((iVar1 == 0) && (local_1c != 0x5f)) {
      this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
      ublib::Shared_string::Shared_string(&local_38,"expected a variable");
      Parse_error::Parse_error(this_00,&local_38);
      __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    while( true ) {
      local_1c = std::istream::peek();
      iVar1 = isalnum(local_1c);
      if (((iVar1 == 0) && (local_1c != 0x5f)) && (local_1c != 0x27)) break;
      std::istream::get();
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_var() {
      eat_whitespace();
      auto ch = inp.get();

      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_var();
      }

      if (not(std::isalpha(ch) or ch == '_')) {
        throw Parse_error("expected a variable");
      }

      std::string buffer;
      buffer.push_back(static_cast<char>(ch));
      for (;;) {
        ch = inp.peek();
        if (std::isalnum(ch) or ch == '_' or ch == '\'') {
          inp.get();
          buffer.push_back(static_cast<char>(ch));
        } else {
          break;
        }
      }
      return buffer;
    }